

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BST.hpp
# Opt level: O0

void __thiscall
supermap::BST<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>::add
          (BST<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> *this,Key<1UL> *key,
          ByteArray<1UL> *value)

{
  ByteArray<1UL> *in_RDX;
  ByteArray<1UL> *in_RSI;
  
  std::
  map<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_std::less<supermap::Key<1UL>_>,_std::allocator<std::pair<const_supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
  ::operator[]((map<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_std::less<supermap::Key<1UL>_>,_std::allocator<std::pair<const_supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
                *)this,key);
  ByteArray<1UL>::operator=(in_RSI,in_RDX);
  return;
}

Assistant:

void add(const Key &key, Value &&value) override {
        map_[key] = std::move(value);
    }